

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInputSource.cc
# Opt level: O0

qpdf_offset_t __thiscall FileInputSource::findAndSkipNextEOL(FileInputSource *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char **ppcVar3;
  undefined4 extraout_var_01;
  char *local_2870;
  char *local_2868;
  char local_2851;
  char *pcStack_2850;
  char ch;
  char *p;
  char *p2;
  char *p1;
  size_t len;
  qpdf_offset_t cur_offset;
  char buf [10240];
  char *pcStack_18;
  bool done;
  qpdf_offset_t result;
  FileInputSource *this_local;
  
  pcStack_18 = (char *)0x0;
  bVar1 = false;
  while (!bVar1) {
    len = QUtil::tell(this->file);
    iVar2 = (*(this->super_InputSource)._vptr_InputSource[7])(this,&cur_offset,0x2800);
    p1 = (char *)CONCAT44(extraout_var,iVar2);
    if (p1 == (char *)0x0) {
      bVar1 = true;
      iVar2 = (*(this->super_InputSource)._vptr_InputSource[4])();
      pcStack_18 = (char *)CONCAT44(extraout_var_00,iVar2);
    }
    else {
      p2 = (char *)memchr(&cur_offset,0xd,(size_t)p1);
      p = (char *)memchr(&cur_offset,10,(size_t)p1);
      if ((p2 == (char *)0x0) || (p == (char *)0x0)) {
        local_2870 = p;
        if (p2 != (char *)0x0) {
          local_2870 = p2;
        }
        local_2868 = local_2870;
      }
      else {
        ppcVar3 = std::min<char*>(&p2,&p);
        local_2868 = *ppcVar3;
      }
      pcStack_2850 = local_2868;
      if (local_2868 != (char *)0x0) {
        pcStack_18 = local_2868 + (len - (long)&cur_offset);
        (*(this->super_InputSource)._vptr_InputSource[5])(this,pcStack_18 + 1,0);
        while (!bVar1) {
          iVar2 = (*(this->super_InputSource)._vptr_InputSource[7])(this,&local_2851,1);
          if (CONCAT44(extraout_var_01,iVar2) == 0) {
            bVar1 = true;
          }
          else if ((local_2851 != '\r') && (local_2851 != '\n')) {
            (*(this->super_InputSource)._vptr_InputSource[8])(this,(ulong)(uint)(int)local_2851);
            bVar1 = true;
          }
        }
      }
    }
  }
  return (qpdf_offset_t)pcStack_18;
}

Assistant:

qpdf_offset_t
FileInputSource::findAndSkipNextEOL()
{
    qpdf_offset_t result = 0;
    bool done = false;
    char buf[10240];
    while (!done) {
        qpdf_offset_t cur_offset = QUtil::tell(this->file);
        size_t len = this->read(buf, sizeof(buf));
        if (len == 0) {
            done = true;
            result = this->tell();
        } else {
            char* p1 = static_cast<char*>(memchr(buf, '\r', len));
            char* p2 = static_cast<char*>(memchr(buf, '\n', len));
            char* p = (p1 && p2) ? std::min(p1, p2) : p1 ? p1 : p2;
            if (p) {
                result = cur_offset + (p - buf);
                // We found \r or \n.  Keep reading until we get past \r and \n characters.
                this->seek(result + 1, SEEK_SET);
                char ch;
                while (!done) {
                    if (this->read(&ch, 1) == 0) {
                        done = true;
                    } else if (!((ch == '\r') || (ch == '\n'))) {
                        this->unreadCh(ch);
                        done = true;
                    }
                }
            }
        }
    }
    return result;
}